

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow *window,ImGuiViewportP *viewport)

{
  ImGuiViewportP *pIVar1;
  bool bVar2;
  ImGuiWindow **ppIVar3;
  int local_84;
  int n_1;
  ImGuiViewportP *old_viewport;
  ImRect local_68;
  ImGuiWindow *local_58;
  ImGuiWindow *window_behind;
  int n;
  ImRect IStack_48;
  ImRect local_38;
  ImGuiContext_conflict *local_28;
  ImGuiContext_conflict *g;
  ImGuiViewportP *viewport_local;
  ImGuiWindow *window_local;
  
  local_28 = GImGui;
  if (window->Viewport == viewport) {
    window_local._7_1_ = false;
  }
  else if (((viewport->super_ImGuiViewport).Flags & 0x1000U) == 0) {
    window_local._7_1_ = false;
  }
  else if (((viewport->super_ImGuiViewport).Flags & 0x400U) == 0) {
    g = (ImGuiContext_conflict *)viewport;
    viewport_local = (ImGuiViewportP *)window;
    local_38 = ImGuiViewportP::GetMainRect(viewport);
    IStack_48 = ImGuiWindow::Rect((ImGuiWindow *)viewport_local);
    bVar2 = ImRect::Contains(&local_38,&stack0xffffffffffffffb8);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      bVar2 = GetWindowAlwaysWantOwnViewport((ImGuiWindow *)viewport_local);
      if (bVar2) {
        window_local._7_1_ = false;
      }
      else {
        for (window_behind._4_4_ = 0; window_behind._4_4_ < (local_28->Windows).Size;
            window_behind._4_4_ = window_behind._4_4_ + 1) {
          ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_28->Windows,window_behind._4_4_);
          local_58 = *ppIVar3;
          if (local_58 == (ImGuiWindow *)viewport_local) break;
          if ((((local_58->WasActive & 1U) != 0) && ((local_58->ViewportOwned & 1U) != 0)) &&
             ((local_58->Flags & 0x1000000U) == 0)) {
            local_68 = ImGuiViewportP::GetMainRect(local_58->Viewport);
            _old_viewport = ImGuiWindow::Rect((ImGuiWindow *)viewport_local);
            bVar2 = ImRect::Overlaps(&local_68,(ImRect *)&old_viewport);
            if (bVar2) {
              return false;
            }
          }
        }
        pIVar1 = (ImGuiViewportP *)(viewport_local->super_ImGuiViewport).DrawData;
        if (((uint)(viewport_local->DrawDataP).DisplaySize.y & 0x10000) != 0) {
          for (local_84 = 0; local_84 < (local_28->Windows).Size; local_84 = local_84 + 1) {
            ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_28->Windows,local_84);
            if ((*ppIVar3)->Viewport == pIVar1) {
              ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&local_28->Windows,local_84);
              SetWindowViewport(*ppIVar3,(ImGuiViewportP *)g);
            }
          }
        }
        SetWindowViewport((ImGuiWindow *)viewport_local,(ImGuiViewportP *)g);
        BringWindowToDisplayFront((ImGuiWindow *)viewport_local);
        window_local._7_1_ = true;
      }
    }
    else {
      window_local._7_1_ = false;
    }
  }
  else {
    window_local._7_1_ = false;
  }
  return window_local._7_1_;
}

Assistant:

static bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (window->Viewport == viewport)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows) == 0)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_Minimized) != 0)
        return false;
    if (!viewport->GetMainRect().Contains(window->Rect()))
        return false;
    if (GetWindowAlwaysWantOwnViewport(window))
        return false;

    // FIXME: Can't use g.WindowsFocusOrder[] for root windows only as we care about Z order. If we maintained a DisplayOrder along with FocusOrder we could..
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window_behind = g.Windows[n];
        if (window_behind == window)
            break;
        if (window_behind->WasActive && window_behind->ViewportOwned && !(window_behind->Flags & ImGuiWindowFlags_ChildWindow))
            if (window_behind->Viewport->GetMainRect().Overlaps(window->Rect()))
                return false;
    }

    // Move to the existing viewport, Move child/hosted windows as well (FIXME-OPT: iterate child)
    ImGuiViewportP* old_viewport = window->Viewport;
    if (window->ViewportOwned)
        for (int n = 0; n < g.Windows.Size; n++)
            if (g.Windows[n]->Viewport == old_viewport)
                SetWindowViewport(g.Windows[n], viewport);
    SetWindowViewport(window, viewport);
    BringWindowToDisplayFront(window);

    return true;
}